

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

ON_OBSOLETE_V5_Annotation *
ON_OBSOLETE_V5_Annotation::CreateFromV2Annotation
          (ON_OBSOLETE_V2_Annotation *V2_annotation,ON_3dmAnnotationContext *annotation_context)

{
  ON_OBSOLETE_V2_Annotation *pOVar1;
  ON_OBSOLETE_V5_Annotation *pOVar2;
  ON_OBSOLETE_V2_TextObject *V2_text_object;
  ON_OBSOLETE_V2_DimRadial *V2_radial_dimension;
  ON_OBSOLETE_V2_DimLinear *V2_linear_dimension;
  ON_OBSOLETE_V2_DimAngular *V2_angular_dimension;
  ON_OBSOLETE_V5_DimAngular *pOVar3;
  ON_OBSOLETE_V2_Annotation *V2_leader;
  
  pOVar1 = &ON_OBSOLETE_V2_Leader::Cast((ON_Object *)V2_annotation)->super_ON_OBSOLETE_V2_Annotation
  ;
  V2_leader = (ON_OBSOLETE_V2_Annotation *)0x0;
  if (V2_annotation->m_type == dtLeader) {
    V2_leader = V2_annotation;
  }
  if (pOVar1 != (ON_OBSOLETE_V2_Annotation *)0x0) {
    V2_leader = pOVar1;
  }
  if (V2_leader != (ON_OBSOLETE_V2_Annotation *)0x0) {
    pOVar2 = &ON_OBSOLETE_V5_Leader::CreateFromV2Leader
                        ((ON_OBSOLETE_V2_Leader *)V2_leader,annotation_context,
                         (ON_OBSOLETE_V5_Leader *)0x0)->super_ON_OBSOLETE_V5_Annotation;
    return pOVar2;
  }
  V2_text_object = ON_OBSOLETE_V2_TextObject::Cast((ON_Object *)V2_annotation);
  if (V2_text_object != (ON_OBSOLETE_V2_TextObject *)0x0) {
    pOVar2 = &ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject
                        (V2_text_object,annotation_context,(ON_OBSOLETE_V5_TextObject *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar2;
  }
  V2_radial_dimension = ON_OBSOLETE_V2_DimRadial::Cast((ON_Object *)V2_annotation);
  if (V2_radial_dimension != (ON_OBSOLETE_V2_DimRadial *)0x0) {
    pOVar2 = &ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension
                        (V2_radial_dimension,annotation_context,(ON_OBSOLETE_V5_DimRadial *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar2;
  }
  V2_linear_dimension = ON_OBSOLETE_V2_DimLinear::Cast((ON_Object *)V2_annotation);
  if (V2_linear_dimension != (ON_OBSOLETE_V2_DimLinear *)0x0) {
    pOVar2 = &ON_OBSOLETE_V5_DimLinear::CreateFromV2LinearDimension
                        (V2_linear_dimension,annotation_context,(ON_OBSOLETE_V5_DimLinear *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar2;
  }
  V2_angular_dimension = ON_OBSOLETE_V2_DimAngular::Cast((ON_Object *)V2_annotation);
  if (V2_angular_dimension != (ON_OBSOLETE_V2_DimAngular *)0x0) {
    pOVar3 = ON_OBSOLETE_V5_DimAngular::CreateFromV2AngularDimension
                       (V2_angular_dimension,annotation_context,(ON_OBSOLETE_V5_DimAngular *)0x0);
    return &pOVar3->super_ON_OBSOLETE_V5_Annotation;
  }
  return (ON_OBSOLETE_V5_Annotation *)0x0;
}

Assistant:

ON_OBSOLETE_V5_Annotation* ON_OBSOLETE_V5_Annotation::CreateFromV2Annotation(
  const class ON_OBSOLETE_V2_Annotation& V2_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  for (;;)
  {
    const ON_OBSOLETE_V2_Leader* V2_leader = ON_OBSOLETE_V2_Leader::Cast(&V2_annotation);
    if (nullptr == V2_leader && ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader == V2_annotation.m_type)
      V2_leader = static_cast<const ON_OBSOLETE_V2_Leader*>(&V2_annotation);
    if (nullptr == V2_leader)
      break;
    return ON_OBSOLETE_V5_Leader::CreateFromV2Leader(
      *V2_leader,
      annotation_context,
      nullptr
    );
  }

  for(;;)
  {
    const ON_OBSOLETE_V2_TextObject* V2_text_object = ON_OBSOLETE_V2_TextObject::Cast(&V2_annotation);
    if (nullptr == V2_text_object)
      break;
    return ON_OBSOLETE_V5_TextObject::CreateFromV2TextObject(
      *V2_text_object,
      annotation_context,
      nullptr
    );
  }

  for(;;)
  {
    const ON_OBSOLETE_V2_DimRadial* V2_radial_dimension = ON_OBSOLETE_V2_DimRadial::Cast(&V2_annotation);
    if (nullptr == V2_radial_dimension)
      break;
    return ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension(
      *V2_radial_dimension,
      annotation_context,
      nullptr
    );
  }

  for(;;)
  {
    const ON_OBSOLETE_V2_DimLinear* V2_linear_dimension = ON_OBSOLETE_V2_DimLinear::Cast(&V2_annotation);
    if (nullptr == V2_linear_dimension)
      break;
    return ON_OBSOLETE_V5_DimLinear::CreateFromV2LinearDimension(
      *V2_linear_dimension,
      annotation_context,
      nullptr
    );
  }
  
  for(;;)
  {
    const ON_OBSOLETE_V2_DimAngular* V2_angular_dimension = ON_OBSOLETE_V2_DimAngular::Cast(&V2_annotation);
    if (nullptr == V2_angular_dimension)
      break;
    return ON_OBSOLETE_V5_DimAngular::CreateFromV2AngularDimension(
      *V2_angular_dimension,
      annotation_context,
      nullptr
    );
  }

  return nullptr;
}